

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiGetMemoryCommitment.cpp
# Opt level: O1

bool __thiscall
vkt::api::MemoryCommitmentTestInstance::isDeviceMemoryCommitmentOk
          (MemoryCommitmentTestInstance *this,VkMemoryRequirements memoryRequirements)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  VkPhysicalDevice physicalDevice;
  InstanceInterface *vk;
  VkDevice device;
  DeviceInterface *vk_00;
  ulong uVar5;
  bool bVar6;
  VkMemoryAllocateInfo memAllocInfo;
  Move<vk::Handle<(vk::HandleType)7>_> memory;
  VkPhysicalDeviceMemoryProperties pMemoryProperties;
  ulong local_290;
  VkDeviceSize local_288;
  VkDeviceSize local_280;
  TextureFormat local_278;
  void *local_270;
  VkDeviceSize local_268;
  deUint32 local_260;
  Move<vk::Handle<(vk::HandleType)7>_> local_258;
  VkPhysicalDeviceMemoryProperties local_238;
  
  physicalDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  vk = Context::getInstanceInterface((this->super_TestInstance).m_context);
  ::vk::getPhysicalDeviceMemoryProperties(&local_238,vk,physicalDevice);
  iVar1 = (this->m_renderSize).m_data[1];
  iVar2 = (this->m_renderSize).m_data[0];
  local_278 = ::vk::mapVkFormat(VK_FORMAT_R32_UINT);
  iVar4 = tcu::TextureFormat::getPixelSize(&local_278);
  local_280 = (VkDeviceSize)(iVar4 * iVar1 * iVar2);
  local_288 = memoryRequirements.size;
  bVar6 = true;
  uVar5 = 0;
  do {
    if ((local_238.memoryTypes[uVar5].propertyFlags & 0x10) != 0) {
      local_278.order = RG;
      local_270 = (void *)0x0;
      local_268 = local_280;
      local_260 = (deUint32)uVar5;
      device = Context::getDevice((this->super_TestInstance).m_context);
      vk_00 = Context::getDeviceInterface((this->super_TestInstance).m_context);
      ::vk::allocateMemory
                (&local_258,vk_00,device,(VkMemoryAllocateInfo *)&local_278,
                 (VkAllocationCallbacks *)0x0);
      local_290 = 0;
      (*vk_00->_vptr_DeviceInterface[0xb])
                (vk_00,device,
                 local_258.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal,
                 &local_290);
      uVar3 = local_290;
      if (local_258.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
                  (&local_258.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter,
                   (VkDeviceMemory)
                   local_258.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal)
        ;
      }
      if (uVar3 <= local_288) {
        return bVar6;
      }
    }
    bVar6 = uVar5 < 0x1f;
    uVar5 = uVar5 + 1;
    if (uVar5 == 0x20) {
      return bVar6;
    }
  } while( true );
}

Assistant:

bool MemoryCommitmentTestInstance::isDeviceMemoryCommitmentOk(const VkMemoryRequirements memoryRequirements)
{
	const VkFormat							colorFormat			= VK_FORMAT_R32_UINT;
	const VkPhysicalDevice					physicalDevice		= m_context.getPhysicalDevice();
	const InstanceInterface&				vki					= m_context.getInstanceInterface();
	const VkMemoryPropertyFlags				propertyFlag		= VK_MEMORY_PROPERTY_LAZILY_ALLOCATED_BIT;
	const VkPhysicalDeviceMemoryProperties	pMemoryProperties	= getPhysicalDeviceMemoryProperties(vki,physicalDevice);
	const VkDeviceSize						pixelDataSize		= m_renderSize.x() * m_renderSize.y() * mapVkFormat(colorFormat).getPixelSize();

	for (deUint32 memTypeNdx = 0u; memTypeNdx < VK_MAX_MEMORY_TYPES; ++memTypeNdx)
	{
		if((pMemoryProperties.memoryTypes[memTypeNdx].propertyFlags & propertyFlag) == propertyFlag) //if supports Lazy allocation
		{
			const VkMemoryAllocateInfo	memAllocInfo =
			{
				VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO,		//	VkStructureType		sType
				NULL,										//	const void*			pNext
				pixelDataSize,								//	VkDeviceSize		allocationSize
				memTypeNdx									//	deUint32			memoryTypeIndex
			};
			const VkDevice			device					= m_context.getDevice();
			const DeviceInterface&	vkd						= m_context.getDeviceInterface();
			Move<VkDeviceMemory>	memory					= allocateMemory(vkd, device, &memAllocInfo, (const VkAllocationCallbacks*)DE_NULL);
			VkDeviceSize			pCommittedMemoryInBytes = 0u;
			vkd.getDeviceMemoryCommitment(device, memory.get(), &pCommittedMemoryInBytes);
			if(pCommittedMemoryInBytes <= memoryRequirements.size)
				return true;
		}
	}
	return false;
}